

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O0

wchar_t borg_slot(wchar_t tval,wchar_t sval)

{
  borg_item_conflict *item;
  wchar_t n;
  wchar_t i;
  wchar_t sval_local;
  wchar_t tval_local;
  
  item._0_4_ = L'\xffffffff';
  for (item._4_4_ = L'\0'; item._4_4_ < (int)(uint)z_info->pack_size;
      item._4_4_ = item._4_4_ + L'\x01') {
    if (((((borg_items[item._4_4_].iqty != '\0') && ((borg_items[item._4_4_].aware & 1U) != 0)) &&
         ((uint)borg_items[item._4_4_].tval == tval)) && ((uint)borg_items[item._4_4_].sval == sval)
        ) && ((((wchar_t)item < L'\0' ||
               (borg_items[item._4_4_].iqty <= borg_items[(wchar_t)item].iqty)) &&
              (((wchar_t)item < L'\0' ||
               ((borg_items[(wchar_t)item].pval <= borg_items[item._4_4_].pval ||
                (borg_items[item._4_4_].iqty <= borg_items[(wchar_t)item].iqty)))))))) {
      item._0_4_ = item._4_4_;
    }
  }
  return (wchar_t)item;
}

Assistant:

int borg_slot(int tval, int sval)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip un-aware items */
        if (!item->aware)
            continue;

        /* Require correct tval */
        if (item->tval != tval)
            continue;

        /* Require correct sval */
        if (item->sval != sval)
            continue;

        /* Prefer smallest pile */
        if ((n >= 0) && (item->iqty > borg_items[n].iqty))
            continue;

        /* Prefer largest "pval" (even if smaller pile)*/
        if ((n >= 0) && (item->pval < borg_items[n].pval)
            && (item->iqty > borg_items[n].iqty))
            continue;

        /* Save this item */
        n = i;
    }

    /* Done */
    return n;
}